

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O3

int wally_confidential_addr_from_addr_segwit
              (char *address,char *addr_family,char *confidential_addr_family,uchar *pub_key,
              size_t pub_key_len,char **output)

{
  size_t sVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  uint64_t uVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  undefined1 auVar13 [16];
  uchar buf [65];
  char result [1001];
  uint8_t data [1000];
  size_t local_868;
  size_t local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  uchar local_838;
  byte local_808 [1008];
  byte local_418 [1000];
  
  local_868 = 0x22;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  auVar13._0_4_ = -(uint)(address == (char *)0x0);
  auVar13._4_4_ = -(uint)(addr_family == (char *)0x0);
  auVar13._8_4_ = -(uint)(confidential_addr_family == (char *)0x0);
  auVar13._12_4_ = -(uint)(pub_key == (uchar *)0x0);
  iVar6 = movmskps((int)confidential_addr_family,auVar13);
  if ((pub_key_len != 0x21 || output == (char **)0x0) || iVar6 != 0) {
    return -2;
  }
  sVar4 = strlen(confidential_addr_family);
  if (999 < sVar4) {
    return -2;
  }
  iVar6 = wally_addr_segwit_to_bytes
                    (address,addr_family,0,(uchar *)((long)&uStack_840 + 7),0x22,&local_868);
  if ((iVar6 == 0) && ((local_868 == 0x22 || (iVar6 = -2, local_868 == 0x16)))) {
    local_838 = pub_key[0x20];
    local_858 = *(undefined8 *)pub_key;
    uStack_850 = *(undefined8 *)(pub_key + 8);
    local_848 = *(undefined8 *)(pub_key + 0x10);
    uStack_840 = *(undefined8 *)(pub_key + 0x18);
    sVar1 = local_868 + 0x1f;
    local_860 = 0;
    if ((local_868 == 0x22) || (local_868 == 0x16)) {
      local_418[0] = 0;
      local_868 = sVar1;
      blech32_convert_bits
                ((uint8_t *)((long)local_418 + 1),&local_860,5,(uint8_t *)&local_858,sVar1,8,1);
      sVar1 = local_860;
      uVar9 = 1;
      lVar10 = 0;
      bVar7 = *confidential_addr_family;
      bVar2 = bVar7;
      while (bVar2 != 0) {
        if (((byte)(bVar2 + 0x81) < 0xa2) || ((byte)(bVar2 + 0xbf) < 0x1a)) goto LAB_00103ab3;
        uVar9 = blech32_polymod_step(uVar9);
        uVar9 = bVar2 >> 5 ^ uVar9;
        lVar3 = lVar10 + 1;
        lVar10 = lVar10 + 1;
        bVar2 = confidential_addr_family[lVar3];
      }
      if (sVar1 + lVar10 + 0xe < 0x3e9) {
        uVar9 = blech32_polymod_step(uVar9);
        if (bVar7 == 0) {
          pbVar11 = local_808;
        }
        else {
          pbVar12 = (byte *)(confidential_addr_family + 1);
          pbVar11 = local_808;
          do {
            uVar9 = blech32_polymod_step(uVar9);
            *pbVar11 = bVar7;
            uVar9 = bVar7 & 0x1f ^ uVar9;
            pbVar11 = pbVar11 + 1;
            bVar7 = *pbVar12;
            pbVar12 = pbVar12 + 1;
          } while (bVar7 != 0);
        }
        *pbVar11 = 0x31;
        pbVar11 = pbVar11 + 1;
        if (sVar1 != 0xffffffffffffffff) {
          lVar10 = 0;
          do {
            uVar8 = (ulong)local_418[lVar10];
            if (0x1f < uVar8) goto LAB_00103ab3;
            uVar9 = blech32_polymod_step(uVar9);
            uVar9 = uVar9 ^ uVar8;
            pbVar11[lVar10] = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[uVar8];
            lVar10 = lVar10 + 1;
          } while (sVar1 + 1 != lVar10);
          pbVar11 = pbVar11 + lVar10;
        }
        lVar10 = 0xc;
        do {
          uVar9 = blech32_polymod_step(uVar9);
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        lVar10 = 0x37;
        do {
          *pbVar11 = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"
                     [(uint)((uVar9 ^ 1) >> ((byte)lVar10 & 0x3f)) & 0x1f];
          pbVar11 = pbVar11 + 1;
          lVar10 = lVar10 + -5;
        } while (lVar10 != -5);
        *pbVar11 = 0;
        pcVar5 = wally_strdup((char *)local_808);
        *output = pcVar5;
        iVar6 = (uint)(pcVar5 != (char *)0x0) * 3 + -3;
        goto LAB_0010395c;
      }
    }
    else {
      local_868 = sVar1;
      wally_clear_2(local_418,1000,&local_858,sVar1);
    }
LAB_00103ab3:
    iVar6 = -1;
  }
  else {
LAB_0010395c:
    wally_clear(&local_858,0x41);
    wally_clear(local_808,0x3e9);
  }
  return iVar6;
}

Assistant:

int wally_confidential_addr_from_addr_segwit(
    const char *address,
    const char *addr_family,
    const char *confidential_addr_family,
    const unsigned char *pub_key,
    size_t pub_key_len,
    char **output)
{
    char result[WALLY_BLECH32_MAXLEN + 1];
    unsigned char buf[EC_PUBLIC_KEY_LEN + SHA256_LEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    size_t written = SHA256_LEN + 2;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !addr_family || !confidential_addr_family || !pub_key ||
        pub_key_len != EC_PUBLIC_KEY_LEN || !output ||
        strlen(confidential_addr_family) >= WALLY_BLECH32_MAXLEN)
        return WALLY_EINVAL;

    /* get v0 witness programs script */
    ret = wally_addr_segwit_to_bytes(address, addr_family, 0,
                                     hash_bytes_p, written, &written);
    if (ret == WALLY_OK) {
        if ((written != (HASH160_LEN + 2)) && (written != (SHA256_LEN + 2)))
            ret = WALLY_EINVAL;
        else {
            /* Copy the confidentialKey / v0 witness programs */
            memcpy(buf, pub_key, pub_key_len);
            written -= 2;   /* ignore witnessVersion & hashSize */
            written += EC_PUBLIC_KEY_LEN;
            if (!blech32_addr_encode(result, confidential_addr_family, 0, buf, written))
                return WALLY_ERROR;

            *output = wally_strdup(result);
            ret = (*output) ? WALLY_OK : WALLY_ENOMEM;
        }
    }

    wally_clear(buf, sizeof(buf));
    wally_clear(result, sizeof(result));
    return ret;
}